

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicSSOCase3::Run(BasicSSOCase3 *this)

{
  GLuint GVar1;
  uint local_40;
  uint local_3c;
  int data_4;
  int data_3;
  int data_2;
  int data_1;
  int data;
  GLuint sh;
  char *glsl_b;
  char *glsl_a;
  BasicSSOCase3 *this_local;
  
  glsl_b = 
  "#version 430 core\nlayout(local_size_x = 1) in;\nlayout(binding = 3, std430) buffer Output {\n  int g_output;\n};\nvoid main() {\n  g_output = 1;\n}"
  ;
  _data = 
  "#version 430 core\nlayout(local_size_x = 1) in;\nlayout(binding = 3, std430) buffer Output {\n  int g_output;\n};\nvoid main() {\n  g_output = 2;\n}"
  ;
  glsl_a = (char *)this;
  GVar1 = glu::CallLogWrapper::glCreateProgram
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  this->m_program_a = GVar1;
  data_1 = glu::CallLogWrapper::glCreateShader
                     (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                       super_CallLogWrapper,0x91b9);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program_a,data_1);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,data_1);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,data_1,1,&glsl_b,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,data_1);
  glu::CallLogWrapper::glProgramParameteri
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program_a,0x8258,1);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program_a);
  GVar1 = glu::CallLogWrapper::glCreateShaderProgramv
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x91b9,1,(GLchar **)&data);
  this->m_program_b = GVar1;
  data_2 = 0;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_storage_buffer);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,3,this->m_storage_buffer);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,4,&data_2,0x88e1);
  glu::CallLogWrapper::glGenProgramPipelines
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_pipeline);
  glu::CallLogWrapper::glUseProgramStages
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_pipeline,0xffffffff,this->m_program_b);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program_a);
  glu::CallLogWrapper::glBindProgramPipeline
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_pipeline);
  glu::CallLogWrapper::glDispatchCompute
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x200);
  glu::CallLogWrapper::glGetBufferSubData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0,4,&data_3);
  if (data_3 == 1) {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,4,&data_4);
    if (data_4 == 2) {
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program_b);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,1,1);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,4,&local_3c);
      if (local_3c == 2) {
        glu::CallLogWrapper::glUseProgram
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glUseProgramStages
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_pipeline,0x20,this->m_program_a);
        glu::CallLogWrapper::glDispatchCompute
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,1,1);
        glu::CallLogWrapper::glMemoryBarrier
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x200);
        glu::CallLogWrapper::glGetBufferSubData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0,4,&local_40);
        if (local_40 == 1) {
          this_local = (BasicSSOCase3 *)0x0;
        }
        else {
          anon_unknown_0::Output("Data is %d should be 1.\n",(ulong)local_40);
          this_local = (BasicSSOCase3 *)&DAT_ffffffffffffffff;
        }
      }
      else {
        anon_unknown_0::Output("Data is %d should be 2.\n",(ulong)local_3c);
        this_local = (BasicSSOCase3 *)&DAT_ffffffffffffffff;
      }
    }
    else {
      anon_unknown_0::Output("Data is %d should be 2.\n",(ulong)(uint)data_4);
      this_local = (BasicSSOCase3 *)&DAT_ffffffffffffffff;
    }
  }
  else {
    anon_unknown_0::Output("Data is %d should be 1.\n",(ulong)(uint)data_3);
    this_local = (BasicSSOCase3 *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_a =
			"#version 430 core" NL "layout(local_size_x = 1) in;" NL "layout(binding = 3, std430) buffer Output {" NL
			"  int g_output;" NL "};" NL "void main() {" NL "  g_output = 1;" NL "}";

		const char* const glsl_b =
			"#version 430 core" NL "layout(local_size_x = 1) in;" NL "layout(binding = 3, std430) buffer Output {" NL
			"  int g_output;" NL "};" NL "void main() {" NL "  g_output = 2;" NL "}";

		/* create program A */
		{
			m_program_a = glCreateProgram();
			GLuint sh   = glCreateShader(GL_COMPUTE_SHADER);
			glAttachShader(m_program_a, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &glsl_a, NULL);
			glCompileShader(sh);
			glProgramParameteri(m_program_a, GL_PROGRAM_SEPARABLE, GL_TRUE);
			glLinkProgram(m_program_a);
		}
		m_program_b = glCreateShaderProgramv(GL_COMPUTE_SHADER, 1, &glsl_b);

		/* create storage buffer */
		{
			int data = 0;
			glGenBuffers(1, &m_storage_buffer);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(int), &data, GL_STREAM_READ);
		}

		glGenProgramPipelines(1, &m_pipeline);
		glUseProgramStages(m_pipeline, GL_ALL_SHADER_BITS, m_program_b);

		glUseProgram(m_program_a);
		glBindProgramPipeline(m_pipeline);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			int data;
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int), &data);
			if (data != 1)
			{
				Output("Data is %d should be 1.\n", data);
				return ERROR;
			}
		}

		glUseProgram(0);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			int data;
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int), &data);
			if (data != 2)
			{
				Output("Data is %d should be 2.\n", data);
				return ERROR;
			}
		}

		glUseProgram(m_program_b);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			int data;
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int), &data);
			if (data != 2)
			{
				Output("Data is %d should be 2.\n", data);
				return ERROR;
			}
		}

		glUseProgram(0);
		glUseProgramStages(m_pipeline, GL_COMPUTE_SHADER_BIT, m_program_a);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			int data;
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int), &data);
			if (data != 1)
			{
				Output("Data is %d should be 1.\n", data);
				return ERROR;
			}
		}

		return NO_ERROR;
	}